

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

Interval * __thiscall
vkt::shaderexecutor::Functions::Sub::doApply
          (Interval *__return_storage_ptr__,Sub *this,EvalContext *ctx,IArgs *iargs)

{
  Interval *xi;
  Interval *pIVar1;
  deRoundingMode mode;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Interval ret;
  Interval local_60;
  double local_48;
  double local_40;
  Interval local_38;
  
  xi = iargs->a;
  if (xi->m_hasNaN == false) {
    if ((((xi->m_lo <= xi->m_hi) && (xi->m_lo != -INFINITY)) && (xi->m_hi != INFINITY)) &&
       (pIVar1 = iargs->b, pIVar1->m_hasNaN == false)) {
      if (((pIVar1->m_lo <= pIVar1->m_hi) && (pIVar1->m_lo != -INFINITY)) &&
         (pIVar1->m_hi != INFINITY)) {
        local_60.m_hasNaN = false;
        local_60.m_lo = INFINITY;
        local_60.m_hi = -INFINITY;
        mode = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        local_40 = iargs->a->m_lo;
        local_48 = iargs->b->m_hi;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        dVar5 = local_40 - local_48;
        local_60.m_hasNaN = NAN(dVar5);
        dVar2 = -INFINITY;
        if (!local_60.m_hasNaN) {
          dVar2 = dVar5;
        }
        dVar3 = INFINITY;
        if (!local_60.m_hasNaN) {
          dVar3 = dVar5;
        }
        dVar6 = iargs->a->m_hi - iargs->b->m_lo;
        dVar5 = -INFINITY;
        dVar4 = INFINITY;
        if (!NAN(dVar6)) {
          dVar5 = dVar6;
          dVar4 = dVar6;
        }
        local_60.m_hasNaN = local_60.m_hasNaN || NAN(dVar6);
        local_60.m_lo =
             (double)(~-(ulong)(dVar3 <= dVar4) & (ulong)dVar4 |
                     (ulong)dVar3 & -(ulong)(dVar3 <= dVar4));
        local_60.m_hi =
             (double)(~-(ulong)(dVar5 <= dVar2) & (ulong)dVar5 |
                     (ulong)dVar2 & -(ulong)(dVar5 <= dVar2));
        deSetRoundingMode(mode);
        tcu::FloatFormat::roundOut(&local_38,&ctx->format,&local_60,true);
        tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,&local_38);
        return __return_storage_ptr__;
      }
    }
  }
  FloatFunc2::applyMonotone(__return_storage_ptr__,(FloatFunc2 *)this,ctx,xi,iargs->b);
  return __return_storage_ptr__;
}

Assistant:

Interval	doApply		(const EvalContext&	ctx, const IArgs& iargs) const
	{
		// Fast-path for common case
		if (iargs.a.isOrdinary() && iargs.b.isOrdinary())
		{
			Interval ret;

			TCU_SET_INTERVAL_BOUNDS(ret, diff,
									diff = iargs.a.lo() - iargs.b.hi(),
									diff = iargs.a.hi() - iargs.b.lo());
			return ctx.format.convert(ctx.format.roundOut(ret, true));

		}
		else
		{
			return this->applyMonotone(ctx, iargs.a, iargs.b);
		}
	}